

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::OnSelect(TypeChecker *this,TypeVector *expected)

{
  pointer pTVar1;
  pointer pTVar2;
  Result RVar3;
  Result RVar4;
  Result RVar5;
  Enum EVar6;
  ulong uVar7;
  Type TVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  Type type2;
  Type type1;
  Type local_48;
  Type local_40;
  Type local_38;
  
  local_40.enum_ = Any;
  local_40.type_index_ = 0;
  local_48.enum_ = Any;
  local_48.type_index_ = 0;
  local_38.enum_ = Any;
  local_38.type_index_ = 0;
  RVar3 = PeekType(this,0,&local_38);
  EVar6 = local_38.enum_;
  bVar10 = local_38 != (Type)0xffffffff;
  RVar4 = PeekType(this,1,&local_40);
  RVar5 = PeekType(this,2,&local_48);
  bVar10 = (RVar5.enum_ == Error || (RVar4.enum_ == Error || RVar3.enum_ == Error)) ||
           bVar10 && EVar6 != Any;
  pTVar1 = (expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar1 == pTVar2) {
    bVar11 = true;
    if (((7 < (uint)(local_40.enum_ + 0x17)) ||
        ((0xc5U >> (local_40.enum_ + 0x17 & 0x1fU) & 1) == 0)) &&
       ((7 < (uint)(local_48.enum_ + 0x17) || ((0xc5U >> (local_48.enum_ + 0x17 & 0x1fU) & 1) == 0))
       )) {
      uVar9 = (ulong)local_40 & 0xffffffff;
      bVar11 = bVar10 || local_40 != local_48 && (uVar9 != 0 && local_48.enum_ != Any);
      uVar7 = (ulong)local_40 & 0xffffffff00000000;
      goto LAB_0017a18d;
    }
  }
  else {
    if ((long)pTVar2 - (long)pTVar1 != 8) {
      __assert_fail("expected.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/type-checker.cc"
                    ,0x362,"Result wabt::TypeChecker::OnSelect(const TypeVector &)");
    }
    TVar8 = *pTVar1;
    bVar11 = TVar8.enum_ != Any;
    bVar11 = local_48 != TVar8 && (local_48.enum_ != Any && bVar11) ||
             (bVar10 || local_40 != TVar8 && (local_40.enum_ != Any && bVar11));
  }
  uVar9 = 0;
  uVar7 = 0;
LAB_0017a18d:
  TVar8 = (Type)(uVar9 | uVar7);
  RVar3.enum_._1_3_ = 0;
  RVar3.enum_._0_1_ = bVar11;
  PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type::Enum>(this,RVar3,"select",TVar8,TVar8,I32);
  RVar3 = DropTypes(this,3);
  PushType(this,TVar8);
  return (Result)(uint)(byte)(bVar11 | RVar3.enum_ == Error);
}

Assistant:

Result TypeChecker::OnSelect(const TypeVector& expected) {
  Result result = Result::Ok;
  Type type1 = Type::Any;
  Type type2 = Type::Any;
  Type result_type = Type::Any;
  result |= PeekAndCheckType(0, Type::I32);
  result |= PeekType(1, &type1);
  result |= PeekType(2, &type2);
  if (expected.empty()) {
    if (type1.IsRef() || type2.IsRef()) {
      result = Result::Error;
    } else {
      result |= CheckType(type1, type2);
      result_type = type1;
    }
  } else {
    assert(expected.size() == 1);
    result |= CheckType(type1, expected[0]);
    result |= CheckType(type2, expected[0]);
  }
  PrintStackIfFailed(result, "select", result_type, result_type, Type::I32);
  result |= DropTypes(3);
  PushType(result_type);
  return result;
}